

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O3

void * __thiscall CVmGramProdMem::alloc(CVmGramProdMem *this,size_t siz)

{
  CVmGramProdMemBlock *pCVar1;
  char *pcVar2;
  CVmGramProdMemBlock *pCVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = siz + 7 & 0xfffffffffffffff8;
  if (uVar5 < 0x4001) {
    uVar4 = this->cur_rem_;
    if (uVar4 < uVar5) {
      pCVar1 = this->block_cur_;
      if (pCVar1 == (CVmGramProdMemBlock *)0x0) {
        pCVar3 = (CVmGramProdMemBlock *)malloc(0x4008);
        this->block_head_ = pCVar3;
        this->block_cur_ = pCVar3;
        pCVar3->nxt_ = (CVmGramProdMemBlock *)0x0;
      }
      else {
        pCVar3 = pCVar1->nxt_;
        if (pCVar3 == (CVmGramProdMemBlock *)0x0) {
          pCVar3 = (CVmGramProdMemBlock *)malloc(0x4008);
          pCVar1->nxt_ = pCVar3;
          pCVar1 = this->block_cur_->nxt_;
          this->block_cur_ = pCVar1;
          pCVar1->nxt_ = (CVmGramProdMemBlock *)0x0;
          pCVar3 = this->block_cur_;
        }
        else {
          this->block_cur_ = pCVar3;
        }
      }
      pcVar2 = pCVar3->buf_;
      uVar4 = 0x4000;
    }
    else {
      pcVar2 = this->cur_free_;
    }
    this->cur_free_ = pcVar2 + uVar5;
    this->cur_rem_ = uVar4 - uVar5;
  }
  else {
    pcVar2 = (char *)0x0;
  }
  return pcVar2;
}

Assistant:

void *alloc(size_t siz)
    {
        void *ret;
        
        /* round the size to the local hardware boundary */
        siz = osrndsz(siz);

        /* if it exceeds the block size, fail */
        if (siz > VMGRAMPROD_MEM_BLOCK_SIZE)
            return 0;

        /* if we don't have enough space in this block, go to the next */
        if (siz > cur_rem_)
        {
            /* allocate a new block if necessary */
            if (block_cur_ == 0)
            {
                /* there's nothing in the list yet - set up the first block */
                block_head_ = (CVmGramProdMemBlock *)
                              t3malloc(sizeof(CVmGramProdMemBlock));

                /* activate the new block */
                block_cur_ = block_head_;

                /* there's nothing after this block */
                block_cur_->nxt_ = 0;
            }
            else if (block_cur_->nxt_ == 0)
            {
                /* we're at the end of the list - add a block */
                block_cur_->nxt_ = (CVmGramProdMemBlock *)
                                   t3malloc(sizeof(CVmGramProdMemBlock));

                /* advance to the new block */
                block_cur_ = block_cur_->nxt_;

                /* the new block is the last in the chain */
                block_cur_->nxt_ = 0;
            }
            else
            {
                /* another block follows - advance to it */
                block_cur_ = block_cur_->nxt_;
            }

            /* start at the beginning of the new block */
            cur_free_ = block_cur_->buf_;

            /* this entire block is available */
            cur_rem_ = VMGRAMPROD_MEM_BLOCK_SIZE;
        }

        /* the return value will be the current free pointer */
        ret = cur_free_;

        /* consume the space */
        cur_free_ += siz;
        cur_rem_ -= siz;

        /* return the block location */
        return ret;
    }